

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O1

void __thiscall
so_5::timers_details::
actual_timer_t<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::actual_timer_t(actual_timer_t<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
                 *this,timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                       *thread)

{
  timer_object<timertt::thread_safety::unsafe> *ptVar1;
  
  atomic_refcounted_t::atomic_refcounted_t(&(this->super_timer_t).super_atomic_refcounted_t);
  (this->super_timer_t)._vptr_timer_t = (_func_int **)&PTR__actual_timer_t_00289da0;
  this->m_thread = thread;
  ptVar1 = (timer_object<timertt::thread_safety::unsafe> *)operator_new(0x48);
  ptVar1->_vptr_timer_object = (_func_int **)0x0;
  *(undefined8 *)&ptVar1->m_references = 0;
  ptVar1[1]._vptr_timer_object = (_func_int **)0x0;
  *(undefined8 *)&ptVar1[1].m_references = 0;
  ptVar1[2]._vptr_timer_object = (_func_int **)0x0;
  *(undefined8 *)&ptVar1[2].m_references = 0;
  ptVar1[3]._vptr_timer_object = (_func_int **)0x0;
  *(undefined8 *)&ptVar1[3].m_references = 0;
  ptVar1[4]._vptr_timer_object = (_func_int **)0x0;
  ptVar1->m_references = 0;
  ptVar1->_vptr_timer_object = (_func_int **)&PTR__timer_type_00289de8;
  ptVar1[1]._vptr_timer_object = (_func_int **)0x0;
  *(undefined1 (*) [32])(ptVar1 + 2) = ZEXT432(0) << 0x40;
  (this->m_timer).m_timer = ptVar1;
  ptVar1->m_references = 1;
  return;
}

Assistant:

actual_timer_t(
			TIMER * thread )
			:	m_thread( thread )
			,	m_timer( thread->allocate() )
			{}